

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O0

ssize_t __thiscall wasm::ModuleWriter::write(ModuleWriter *this,int __fd,void *__buf,size_t __n)

{
  string *psVar1;
  long lVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  string local_70;
  string local_40;
  void *local_20;
  string *filename_local;
  Module *wasm_local;
  ModuleWriter *this_local;
  
  filename_local = (string *)CONCAT44(in_register_00000034,__fd);
  local_20 = __buf;
  wasm_local = (Module *)this;
  if (((this->binary & 1U) != 0) &&
     (lVar2 = std::__cxx11::string::size(), psVar1 = filename_local, lVar2 != 0)) {
    std::__cxx11::string::string((string *)&local_40,(string *)__buf);
    writeBinary(this,(Module *)psVar1,&local_40);
    sVar3 = std::__cxx11::string::~string((string *)&local_40);
    return sVar3;
  }
  psVar1 = filename_local;
  std::__cxx11::string::string((string *)&local_70,(string *)__buf);
  writeText(this,(Module *)psVar1,&local_70);
  sVar3 = std::__cxx11::string::~string((string *)&local_70);
  return sVar3;
}

Assistant:

void ModuleWriter::write(Module& wasm, std::string filename) {
  if (binary && filename.size() > 0) {
    writeBinary(wasm, filename);
  } else {
    writeText(wasm, filename);
  }
}